

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport_tcp.cpp
# Opt level: O2

void __thiscall miniros::TransportTCP::parseHeader(TransportTCP *this,Header *header)

{
  bool bVar1;
  allocator<char> local_59;
  string local_58;
  string nodelay;
  
  nodelay._M_dataplus._M_p = (pointer)&nodelay.field_2;
  nodelay._M_string_length = 0;
  nodelay.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"tcp_nodelay",&local_59);
  bVar1 = Header::getValue(header,&local_58,&nodelay);
  if (bVar1) {
    bVar1 = std::operator==(&nodelay,"1");
    std::__cxx11::string::~string((string *)&local_58);
    if (bVar1) {
      if (console::g_initialized == '\0') {
        console::initialize();
      }
      if (parseHeader::loc.initialized_ == false) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_58,"miniros.transport_tcp",&local_59);
        console::initializeLogLocation(&parseHeader::loc,&local_58,Debug);
        std::__cxx11::string::~string((string *)&local_58);
      }
      if (parseHeader::loc.level_ != Debug) {
        console::setLogLocationLevel(&parseHeader::loc,Debug);
        console::checkLogLocationEnabled(&parseHeader::loc);
      }
      if (parseHeader::loc.logger_enabled_ == true) {
        console::print((FilterBase *)0x0,parseHeader::loc.logger_,parseHeader::loc.level_,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport/transport_tcp.cpp"
                       ,0xa5,"virtual void miniros::TransportTCP::parseHeader(const Header &)",
                       "Setting nodelay on socket [%d]",(ulong)(uint)this->sock_);
      }
      setNoDelay(this,true);
    }
  }
  else {
    std::__cxx11::string::~string((string *)&local_58);
  }
  std::__cxx11::string::~string((string *)&nodelay);
  return;
}

Assistant:

void TransportTCP::parseHeader(const Header& header)
{
  std::string nodelay;
  if (header.getValue("tcp_nodelay", nodelay) && nodelay == "1")
  {
    MINIROS_DEBUG("Setting nodelay on socket [%d]", sock_);
    setNoDelay(true);
  }
}